

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::
cni_helper<void(*)(cs::object_method&,cs_impl::any_const&),void(*)(cs::object_method&,cs_impl::any_const&)>
::_call<0,1>(cni_helper<void_(*)(cs::object_method_&,_const_cs_impl::any_&),_void_(*)(cs::object_method_&,_const_cs_impl::any_&)>
             *this,vector *args,sequence<0,_1> *param_3)

{
  object_method *__args_1;
  reference val;
  object_method *in_RDX;
  function<void_(cs::object_method_&,_const_cs_impl::any_&)> *in_RSI;
  var *in_stack_00000100;
  
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[]
            ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_RSI,0);
  __args_1 = try_convert_and_check<cs::object_method_&,_cs::object_method_&,_cs::object_method,_0UL>
             ::convert(in_stack_00000100);
  val = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[]
                  ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_RSI,1);
  try_convert_and_check<const_cs_impl::any_&,_const_cs_impl::any_&,_cs_impl::any,_1UL>::convert(val)
  ;
  std::function<void_(cs::object_method_&,_const_cs_impl::any_&)>::operator()
            (in_RSI,in_RDX,&__args_1->object);
  return;
}

Assistant:

void _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...);
		}